

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portable-file-dialogs.h
# Opt level: O3

void __thiscall
pfd::internal::file_dialog::file_dialog
          (file_dialog *this,type in_type,string *title,string *default_path,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filters,opt options)

{
  long lVar1;
  value_type *__x;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t sVar4;
  long *plVar5;
  ulong *puVar6;
  long *plVar7;
  size_type *psVar8;
  pointer pbVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _Alloc_hider _Var12;
  undefined3 in_register_00000089;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  long lVar14;
  bool bVar15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename_arg;
  stat s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  value_type *local_158;
  long *local_150;
  string *local_148;
  long local_140;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  undefined1 local_110 [148];
  type local_7c;
  file_dialog *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_160 = filters;
  pfd::settings::settings((settings *)this,false);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x48);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0027a8d8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[2]._M_weak_count = 0;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&p_Var3[1]._M_use_count = &p_Var3[2]._M_use_count;
  p_Var3[3]._M_use_count = -1;
  *(undefined4 *)&p_Var3[4]._vptr__Sp_counted_base = 0xffffffff;
  (this->super_dialog).m_async.
  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
  ;
  (this->super_dialog).m_async.
  super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  if (pfd::settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') {
    if (pfd::settings::flags(pfd::settings::flag)::flags._3_1_ == '\0') {
      if (pfd::settings::flags(pfd::settings::flag)::flags._4_1_ == '\0') {
        pcVar10 = "echo";
        if (pfd::settings::flags(pfd::settings::flag)::flags._5_1_ != '\0') {
          pcVar10 = "kdialog";
        }
      }
      else {
        pcVar10 = "qarma";
      }
    }
    else {
      pcVar10 = "matedialog";
    }
  }
  else {
    pcVar10 = "zenity";
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_110 + 0x10);
  local_110._0_8_ = paVar11;
  local_78 = this;
  sVar4 = strlen(pcVar10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,pcVar10,pcVar10 + sVar4);
  __l._M_len = 1;
  __l._M_array = (iterator)local_110;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_178,__l,(allocator_type *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != paVar11) {
    operator_delete((void *)local_110._0_8_);
  }
  if (((pfd::settings::flags(pfd::settings::flag)::flags._2_1_ == '\0') &&
      (pfd::settings::flags(pfd::settings::flag)::flags._3_1_ == '\0')) &&
     (pfd::settings::flags(pfd::settings::flag)::flags._4_1_ != '\x01')) {
    if (pfd::settings::flags(pfd::settings::flag)::flags._5_1_ != '\x01') goto LAB_00149e53;
    if (in_type == open) {
      local_110._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--getopenfilename","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
LAB_00149fcd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != paVar11) {
        operator_delete((void *)local_110._0_8_);
      }
    }
    else {
      if (in_type == folder) {
        local_110._0_8_ = paVar11;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"--getexistingdirectory","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        goto LAB_00149fcd;
      }
      if (in_type == save) {
        local_110._0_8_ = paVar11;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--getsavefilename","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        goto LAB_00149fcd;
      }
    }
    local_158 = title;
    if ((options & multiselect) != none) {
      local_110._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--multiple","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != paVar11) {
        operator_delete((void *)local_110._0_8_);
      }
      local_110._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--separate-output","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != paVar11) {
        operator_delete((void *)local_110._0_8_);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_178,default_path);
    local_110._8_8_ = 0;
    local_110._16_8_ = local_110._16_8_ & 0xffffffffffffff00;
    pbVar9 = (local_160->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_110._0_8_ = paVar11;
    if (0x20 < (ulong)((long)(local_160->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9)) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        pcVar10 = " | ";
        if (uVar13 == 0) {
          pcVar10 = "";
        }
        std::operator+(&local_50,pcVar10,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(pbVar9->_M_dataplus)._M_p + lVar14));
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_60 = *plVar7;
          lStack_58 = plVar5[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar7;
          local_70 = (long *)*plVar5;
        }
        local_68 = plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_70,
                                    *(ulong *)((long)&(local_160->
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p + lVar14));
        plVar7 = plVar5 + 2;
        if ((long *)*plVar5 == plVar7) {
          local_140 = *plVar7;
          lStack_138 = plVar5[3];
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar7;
          local_150 = (long *)*plVar5;
        }
        local_148 = (string *)plVar5[1];
        *plVar5 = (long)plVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_130.field_2._M_allocated_capacity = *psVar8;
          local_130.field_2._8_8_ = plVar5[3];
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar8;
          local_130._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_130._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append(local_110,(ulong)local_130._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar13 = uVar13 + 1;
        pbVar9 = (local_160->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x40;
      } while (uVar13 < (ulong)((long)(local_160->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >>
                               5) >> 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_178,(value_type *)local_110);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"--title","");
    __x = local_158;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               &local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_178,__x);
    _Var12._M_p = (pointer)local_110._0_8_;
    if ((undefined1 *)local_110._0_8_ == local_110 + 0x10) goto LAB_00149e53;
  }
  else {
    local_110._0_8_ = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--file-selection","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != paVar11) {
      operator_delete((void *)local_110._0_8_);
    }
    std::operator+(&local_130,"--filename=",default_path);
    if (in_type != folder) {
      local_150 = &local_140;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/","");
      if (((string *)default_path->_M_string_length < local_148) ||
         (iVar2 = std::__cxx11::string::compare
                            ((ulong)default_path,
                             (long)default_path->_M_string_length - (long)local_148,local_148),
         iVar2 != 0)) {
        iVar2 = stat((default_path->_M_dataplus)._M_p,(stat *)local_110);
        bVar15 = (local_110._24_4_ & 0xf000) == 0x4000 && iVar2 == 0;
      }
      else {
        bVar15 = false;
      }
      if (local_150 != &local_140) {
        operator_delete(local_150);
      }
      if (bVar15) {
        std::__cxx11::string::append((char *)&local_130);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_178,&local_130);
    local_110._0_8_ = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--title","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != paVar11) {
      operator_delete((void *)local_110._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_178,title);
    local_110._0_8_ = paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--separator=\n","");
    local_158 = (value_type *)CONCAT44(local_158._4_4_,CONCAT31(in_register_00000089,options));
    local_7c = in_type;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._0_8_ != paVar11) {
      operator_delete((void *)local_110._0_8_);
    }
    if (0x20 < (ulong)((long)(local_160->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_160->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      lVar14 = 0;
      uVar13 = 0;
      do {
        local_110._0_8_ = local_110 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--file-filter","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_);
        }
        pbVar9 = (local_160->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar1 = *(long *)((long)&(pbVar9->_M_dataplus)._M_p + lVar14);
        local_150 = &local_140;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,lVar1,
                   *(long *)((long)&pbVar9->_M_string_length + lVar14) + lVar1);
        std::__cxx11::string::append((char *)&local_150);
        plVar5 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_150,
                                    *(ulong *)((long)&(local_160->
                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p + lVar14));
        local_110._0_8_ = local_110 + 0x10;
        puVar6 = (ulong *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar6) {
          local_110._16_8_ = *puVar6;
          local_110._24_8_ = plVar5[3];
        }
        else {
          local_110._16_8_ = *puVar6;
          local_110._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
        }
        local_110._8_8_ = plVar5[1];
        *plVar5 = (long)puVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150);
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x40;
      } while (uVar13 < (ulong)((long)(local_160->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_160->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 5) >> 1);
    }
    if (local_7c == save) {
      local_110._0_8_ = local_110 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--save","");
      uVar13 = (ulong)local_158 & 0xffffffff;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
LAB_00149db7:
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_);
      }
    }
    else {
      uVar13 = (ulong)local_158 & 0xffffffff;
      if (local_7c == folder) {
        local_110._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_110 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--directory","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
        goto LAB_00149db7;
      }
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_110 + 0x10);
    if ((uVar13 & 2) == 0) {
      local_110._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--confirm-overwrite","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != paVar11) {
        operator_delete((void *)local_110._0_8_);
      }
    }
    if ((uVar13 & 1) != 0) {
      local_110._0_8_ = paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"--multiple","");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ != paVar11) {
        operator_delete((void *)local_110._0_8_);
      }
    }
    _Var12._M_p = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto LAB_00149e53;
  }
  operator_delete(_Var12._M_p);
LAB_00149e53:
  if (pfd::settings::flags(pfd::settings::flag)::flags._1_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"pfd: ",5);
    if (local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar2 = 0;
      pbVar9 = local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar15 = iVar2 != 0;
        iVar2 = iVar2 + -1;
        pcVar10 = "";
        if (bVar15) {
          pcVar10 = " ";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,pcVar10,(ulong)bVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  executor::start_process
            ((local_78->super_dialog).m_async.
             super___shared_ptr<pfd::internal::executor,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_178);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  return;
}

Assistant:

inline internal::file_dialog::file_dialog(type in_type,
            std::string const &title,
            std::string const &default_path /* = "" */,
            std::vector<std::string> const &filters /* = {} */,
            opt options /* = opt::none */)
{
#if _WIN32
    std::string filter_list;
    std::regex whitespace("  *");
    for (size_t i = 0; i + 1 < filters.size(); i += 2)
    {
        filter_list += filters[i] + '\0';
        filter_list += std::regex_replace(filters[i + 1], whitespace, ";") + '\0';
    }
    filter_list += '\0';

    m_async->start_func([this, in_type, title, default_path, filter_list,
                         options](int *exit_code) -> std::string
    {
        (void)exit_code;
        m_wtitle = internal::str2wstr(title);
        m_wdefault_path = internal::str2wstr(default_path);
        auto wfilter_list = internal::str2wstr(filter_list);

        // Initialise COM. This is required for the new folder selection window,
        // (see https://github.com/samhocevar/portable-file-dialogs/pull/21)
        // and to avoid random crashes with GetOpenFileNameW() (see
        // https://github.com/samhocevar/portable-file-dialogs/issues/51)
        ole32_dll ole32;

        // Folder selection uses a different method
        if (in_type == type::folder)
        {
#if PFD_HAS_IFILEDIALOG
            if (flags(flag::is_vista))
            {
                // On Vista and higher we should be able to use IFileDialog for folder selection
                IFileDialog *ifd;
                HRESULT hr = dll::proc<HRESULT WINAPI (REFCLSID, LPUNKNOWN, DWORD, REFIID, LPVOID *)>(ole32, "CoCreateInstance")
                                 (CLSID_FileOpenDialog, nullptr, CLSCTX_INPROC_SERVER, IID_PPV_ARGS(&ifd));

                // In case CoCreateInstance fails (which it should not), try legacy approach
                if (SUCCEEDED(hr))
                    return select_folder_vista(ifd, options & opt::force_path);
            }
#endif

            BROWSEINFOW bi;
            memset(&bi, 0, sizeof(bi));

            bi.lpfn = &bffcallback;
            bi.lParam = (LPARAM)this;

            if (flags(flag::is_vista))
            {
                if (ole32.is_initialized())
                    bi.ulFlags |= BIF_NEWDIALOGSTYLE;
                bi.ulFlags |= BIF_EDITBOX;
                bi.ulFlags |= BIF_STATUSTEXT;
            }

            auto *list = SHBrowseForFolderW(&bi);
            std::string ret;
            if (list)
            {
                auto buffer = new wchar_t[MAX_PATH];
                SHGetPathFromIDListW(list, buffer);
                dll::proc<void WINAPI (LPVOID)>(ole32, "CoTaskMemFree")(list);
                ret = internal::wstr2str(buffer);
                delete[] buffer;
            }
            return ret;
        }

        OPENFILENAMEW ofn;
        memset(&ofn, 0, sizeof(ofn));
        ofn.lStructSize = sizeof(OPENFILENAMEW);
        ofn.hwndOwner = GetActiveWindow();

        ofn.lpstrFilter = wfilter_list.c_str();

        auto woutput = std::wstring(MAX_PATH * 256, L'\0');
        ofn.lpstrFile = (LPWSTR)woutput.data();
        ofn.nMaxFile = (DWORD)woutput.size();
        if (!m_wdefault_path.empty())
        {
            // If a directory was provided, use it as the initial directory. If
            // a valid path was provided, use it as the initial file. Otherwise,
            // let the Windows API decide.
            auto path_attr = GetFileAttributesW(m_wdefault_path.c_str());
            if (path_attr != INVALID_FILE_ATTRIBUTES && (path_attr & FILE_ATTRIBUTE_DIRECTORY))
                ofn.lpstrInitialDir = m_wdefault_path.c_str();
            else if (m_wdefault_path.size() <= woutput.size())
                //second argument is size of buffer, not length of string
                StringCchCopyW(ofn.lpstrFile, MAX_PATH*256+1, m_wdefault_path.c_str());
            else
            {
                ofn.lpstrFileTitle = (LPWSTR)m_wdefault_path.data();
                ofn.nMaxFileTitle = (DWORD)m_wdefault_path.size();
            }
        }
        ofn.lpstrTitle = m_wtitle.c_str();
        ofn.Flags = OFN_NOCHANGEDIR | OFN_EXPLORER;

        dll comdlg32("comdlg32.dll");

        // Apply new visual style (required for windows XP)
        new_style_context ctx;

        if (in_type == type::save)
        {
            if (!(options & opt::force_overwrite))
                ofn.Flags |= OFN_OVERWRITEPROMPT;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_save_file_name(comdlg32, "GetSaveFileNameW");
            if (get_save_file_name(&ofn) == 0)
                return "";
            return internal::wstr2str(woutput.c_str());
        }
        else
        {
            if (options & opt::multiselect)
                ofn.Flags |= OFN_ALLOWMULTISELECT;
            ofn.Flags |= OFN_PATHMUSTEXIST;

            dll::proc<BOOL WINAPI (LPOPENFILENAMEW)> get_open_file_name(comdlg32, "GetOpenFileNameW");
            if (get_open_file_name(&ofn) == 0)
                return "";
        }

        std::string prefix;
        for (wchar_t const *p = woutput.c_str(); *p; )
        {
            auto filename = internal::wstr2str(p);
            p += wcslen(p);
            // In multiselect mode, we advance p one wchar further and
            // check for another filename. If there is one and the
            // prefix is empty, it means we just read the prefix.
            if ((options & opt::multiselect) && *++p && prefix.empty())
            {
                prefix = filename + "/";
                continue;
            }

            m_vector_result.push_back(prefix + filename);
        }

        return "";
    });
#elif __EMSCRIPTEN__
    // FIXME: do something
    (void)in_type;
    (void)title;
    (void)default_path;
    (void)filters;
    (void)options;
#else
    auto command = desktop_helper();

    if (is_osascript())
    {
        std::string script = "set ret to choose";
        switch (in_type)
        {
            case type::save:
                script += " file name";
                break;
            case type::open: default:
                script += " file";
                if (options & opt::multiselect)
                    script += " with multiple selections allowed";
                break;
            case type::folder:
                script += " folder";
                break;
        }

        if (default_path.size())
        {
            if (in_type == type::folder || is_directory(default_path))
                script += " default location ";
            else
                script += " default name ";
            script += osascript_quote(default_path);
        }

        script += " with prompt " + osascript_quote(title);

        if (in_type == type::open)
        {
            // Concatenate all user-provided filter patterns
            std::string patterns;
            for (size_t i = 0; i < filters.size() / 2; ++i)
                patterns += " " + filters[2 * i + 1];

            // Split the pattern list to check whether "*" is in there; if it
            // is, we have to disable filters because there is no mechanism in
            // OS X for the user to override the filter.
            std::regex sep("\\s+");
            std::string filter_list;
            bool has_filter = true;
            std::sregex_token_iterator iter(patterns.begin(), patterns.end(), sep, -1);
            std::sregex_token_iterator end;
            for ( ; iter != end; ++iter)
            {
                auto pat = iter->str();
                if (pat == "*" || pat == "*.*")
                    has_filter = false;
                else if (internal::starts_with(pat, "*."))
                    filter_list += "," + osascript_quote(pat.substr(2, pat.size() - 2));
            }

            if (has_filter && filter_list.size() > 0)
            {
                // There is a weird AppleScript bug where file extensions of length != 3 are
                // ignored, e.g. type{"txt"} works, but type{"json"} does not. Fortunately if
                // the whole list starts with a 3-character extension, everything works again.
                // We use "///" for such an extension because we are sure it cannot appear in
                // an actual filename.
                script += " of type {\"///\"" + filter_list + "}";
            }
        }

        if (in_type == type::open && (options & opt::multiselect))
        {
            script += "\nset s to \"\"";
            script += "\nrepeat with i in ret";
            script += "\n  set s to s & (POSIX path of i) & \"\\n\"";
            script += "\nend repeat";
            script += "\ncopy s to stdout";
        }
        else
        {
            script += "\nPOSIX path of ret";
        }

        command.push_back("-e");
        command.push_back(script);
    }
    else if (is_zenity())
    {
        command.push_back("--file-selection");

        // If the default path is a directory, make sure it ends with "/" otherwise zenity will
        // open the file dialog in the parent directory.
        auto filename_arg = "--filename=" + default_path;
        if (in_type != type::folder && !ends_with(default_path, "/") && internal::is_directory(default_path))
            filename_arg += "/";
        command.push_back(filename_arg);

        command.push_back("--title");
        command.push_back(title);
        command.push_back("--separator=\n");

        for (size_t i = 0; i < filters.size() / 2; ++i)
        {
            command.push_back("--file-filter");
            command.push_back(filters[2 * i] + "|" + filters[2 * i + 1]);
        }

        if (in_type == type::save)
            command.push_back("--save");
        if (in_type == type::folder)
            command.push_back("--directory");
        if (!(options & opt::force_overwrite))
            command.push_back("--confirm-overwrite");
        if (options & opt::multiselect)
            command.push_back("--multiple");
    }
    else if (is_kdialog())
    {
        switch (in_type)
        {
            case type::save: command.push_back("--getsavefilename"); break;
            case type::open: command.push_back("--getopenfilename"); break;
            case type::folder: command.push_back("--getexistingdirectory"); break;
        }
        if (options & opt::multiselect)
        {
            command.push_back("--multiple");
            command.push_back("--separate-output");
        }

        command.push_back(default_path);

        std::string filter;
        for (size_t i = 0; i < filters.size() / 2; ++i)
            filter += (i == 0 ? "" : " | ") + filters[2 * i] + "(" + filters[2 * i + 1] + ")";
        command.push_back(filter);

        command.push_back("--title");
        command.push_back(title);
    }

    if (flags(flag::is_verbose))
        std::cerr << "pfd: " << command << std::endl;

    m_async->start_process(command);
#endif
}